

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocks.c
# Opt level: O1

void psocks_conn_log_data(psocks_connection *conn,PsocksDirection dir,void *vdata,size_t len)

{
  int iVar1;
  void *pvVar2;
  size_t sVar3;
  void *__s;
  ptrlen str;
  
  if (((conn->ps->log_flags & 2) != 0) && (conn->ps->logging_fp != (FILE *)0x0)) {
    if (len != 0) {
      iVar1 = *(int *)((long)&psocks_conn_log_data_direction_names_rel + (ulong)dir * 4);
      __s = vdata;
      do {
        pvVar2 = memchr(__s,10,len);
        sVar3 = (long)pvVar2 + (1 - (long)__s);
        if (pvVar2 == (void *)0x0) {
          sVar3 = len;
        }
        fprintf((FILE *)conn->ps->logging_fp,"c#%lu: %s \"",conn->index,
                (long)&psocks_conn_log_data_direction_names_rel + (long)iVar1);
        str.len = sVar3;
        str.ptr = __s;
        write_c_string_literal(conn->ps->logging_fp,str);
        fwrite("\"\n",2,1,(FILE *)conn->ps->logging_fp);
        len = len - sVar3;
        __s = (void *)((long)__s + sVar3);
      } while (len != 0);
    }
    fflush((FILE *)conn->ps->logging_fp);
    len = 0;
  }
  if (conn->rec_sink != (PsocksDataSink *)0x0) {
    BinarySink_put_data(conn->rec_sink->s[dir]->binarysink_,vdata,len);
    return;
  }
  return;
}

Assistant:

static void psocks_conn_log_data(psocks_connection *conn, PsocksDirection dir,
                                 const void *vdata, size_t len)
{
    if ((conn->ps->log_flags & LOG_DIALOGUE) && conn->ps->logging_fp) {
        const char *data = vdata;
        while (len > 0) {
            const char *nl = memchr(data, '\n', len);
            size_t thislen = nl ? (nl+1) - data : len;
            const char *thisdata = data;
            data += thislen;
            len -= thislen;

            static const char *const direction_names[2] = {
                [UP] = "send", [DN] = "recv" };

            fprintf(conn->ps->logging_fp, "c#%"PRIu64": %s \"", conn->index,
                    direction_names[dir]);
            write_c_string_literal(conn->ps->logging_fp,
                                   make_ptrlen(thisdata, thislen));
            fprintf(conn->ps->logging_fp, "\"\n");
        }

        fflush(conn->ps->logging_fp);
    }

    if (conn->rec_sink)
        put_data(conn->rec_sink->s[dir], vdata, len);
}